

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

bool booster::operator<(string_type *l,
                       sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *r)

{
  byte extraout_var;
  string_type local_30;
  
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_30,r);
  std::__cxx11::string::compare((string *)l);
  std::__cxx11::string::~string((string *)&local_30);
  return (bool)(extraout_var >> 7);
}

Assistant:

bool operator<(
		typename sub_match<Iterator>::string_type const &l,
		sub_match<Iterator> const &r) 
	{ return l.compare(r) <0; }